

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
set_caster<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(set_caster<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  bool bVar2;
  handle src_00;
  set s;
  iterator __end3;
  iterator __begin3;
  key_conv conv;
  object local_90;
  iterator local_88;
  iterator local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = set::check_(src);
  if (bVar1) {
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    }
    local_90.super_handle.m_ptr = (handle)(handle)src.m_ptr;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_68.super_object.super_handle.m_ptr = (handle)PyObject_GetIter(src.m_ptr);
    local_68.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_68.ready = false;
    local_88.ready = false;
    local_88.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_88.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
    while( true ) {
      bVar1 = iterator::operator!=(&local_68,&local_88);
      if (!bVar1) break;
      src_00 = iterator::operator*(&local_68);
      bVar2 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              ::load((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      *)&local_50,src_00,convert);
      if (!bVar2) break;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this,&local_50);
      iterator::operator++(&local_68);
    }
    iterator::~iterator(&local_88);
    iterator::~iterator(&local_68);
    bVar1 = !bVar1;
    std::__cxx11::string::~string((string *)&local_50);
    pybind11::object::~object(&local_90);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<pybind11::set>(src))
            return false;
        auto s = reinterpret_borrow<pybind11::set>(src);
        value.clear();
        key_conv conv;
        for (auto entry : s) {
            if (!conv.load(entry, convert))
                return false;
            value.insert(cast_op<Key>(conv));
        }
        return true;
    }